

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O2

Node * __thiscall AvlTree::insert(AvlTree *this,Node *node,int value)

{
  Node *node_00;
  int iVar1;
  int iVar2;
  Node *pNVar3;
  
  if (node == (Node *)0x0) {
    pNVar3 = newNode(this,value);
    return pNVar3;
  }
  if (value < node->value) {
    pNVar3 = insert(this,node->leftChild,value);
    node->leftChild = pNVar3;
  }
  else {
    if (value <= node->value) {
      return node;
    }
    pNVar3 = insert(this,node->rightChild,value);
    node->rightChild = pNVar3;
    pNVar3 = node->leftChild;
  }
  iVar1 = 0;
  iVar2 = 0;
  if (pNVar3 != (Node *)0x0) {
    iVar2 = pNVar3->height;
  }
  node_00 = node->rightChild;
  if (node_00 != (Node *)0x0) {
    iVar1 = node_00->height;
  }
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  node->height = iVar1 + 1;
  iVar2 = getBalance(this,node);
  if (iVar2 < 2) {
    if (-2 < iVar2) {
      return node;
    }
    if (value <= node_00->value) {
      if (node_00->value <= value) {
        return node;
      }
      pNVar3 = rightRotate(this,node_00);
      node->rightChild = pNVar3;
    }
    pNVar3 = leftRotate(this,node);
    return pNVar3;
  }
  if (pNVar3->value <= value) {
    if (value <= pNVar3->value) {
      return node;
    }
    pNVar3 = leftRotate(this,pNVar3);
    node->leftChild = pNVar3;
  }
  pNVar3 = rightRotate(this,node);
  return pNVar3;
}

Assistant:

AvlTree::Node *AvlTree::insert(Node *node, int value) {
    /* 1.  Perform the normal BST insertion */
    if (node == nullptr) {
        return (newNode(value));
    }

    if (value < node->value) {
        node->leftChild = insert(node->leftChild, value);
    } else if (value > node->value) {
        node->rightChild = insert(node->rightChild, value);
    } else {// Equal values are not allowed in BST
        return node;
    }

    /* 2. Update height of this ancestor node */
    node->height = 1 + std::max(height(node->leftChild), height(node->rightChild));

    /* 3. Get the balance factor of this ancestor
          node to check whether this node became
          unbalanced */
    int balance = getBalance(node);

    // If this node becomes unbalanced, then
    // there are 4 cases

    // Left Left Case
    if (balance > 1 && value < node->leftChild->value) {
        return rightRotate(node);
    }

    // Right Right Case
    if (balance < -1 && value > node->rightChild->value) {
        return leftRotate(node);
    }

    // Left Right Case
    if (balance > 1 && value > node->leftChild->value) {
        node->leftChild = leftRotate(node->leftChild);
        return rightRotate(node);
    }

    // Right Left Case
    if (balance < -1 && value < node->rightChild->value) {
        node->rightChild = rightRotate(node->rightChild);
        return leftRotate(node);
    }

    /* return the (unchanged) node pointer */
    return node;
}